

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

uint32 __thiscall Clasp::Asp::PrgBody::scc(PrgBody *this,LogicProgram *prg)

{
  bool bVar1;
  uint uVar2;
  uint32 uVar3;
  PrgAtom *pPVar4;
  size_t *in_RCX;
  uchar *sig;
  PrgBody *in_RSI;
  EVP_PKEY_CTX *ctx;
  PrgBody *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  uint32 j;
  PrgDisj *d;
  head_iterator hEnd;
  head_iterator h;
  Var head;
  atom_iterator aEnd;
  atom_iterator aIt;
  uint32 i;
  bool large;
  uint32 scc;
  uint32 end;
  uint64 sccMask;
  PrgBody *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint32 in_stack_ffffffffffffff74;
  Literal local_70;
  uint32 local_6c;
  PrgDisj *local_68;
  head_iterator local_60;
  head_iterator local_58;
  uint32 local_4c;
  atom_iterator ****local_48;
  atom_iterator ****local_40;
  Literal local_38;
  Literal local_34;
  uint local_30;
  byte local_29;
  uint32 local_28;
  uint32 local_24;
  ulong local_20;
  PrgBody *local_18;
  
  local_20 = 0;
  local_18 = in_RSI;
  local_24 = size(in_RDI);
  local_28 = 0x7ffffff;
  local_29 = 0;
  local_30 = 0;
  do {
    if (local_30 == local_24) {
LAB_001a5a75:
      if (local_20 != 0) {
        local_40 = (atom_iterator ****)0x0;
        local_48 = (atom_iterator ****)0x0;
        local_58 = heads_begin((PrgBody *)
                               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        local_60 = heads_end((PrgBody *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        for (; local_58 != local_60; local_58 = local_58 + 1) {
          bVar1 = PrgEdge::isAtom((PrgEdge *)0x1a5acb);
          if (bVar1) {
            local_4c = PrgEdge::node(local_58);
            local_40 = (atom_iterator ****)&local_4c;
            local_48 = (atom_iterator ****)&local_48;
          }
          else {
            PrgEdge::node(local_58);
            local_68 = LogicProgram::getDisj
                                 ((LogicProgram *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  (Id_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
            local_40 = (atom_iterator ****)PrgDisj::begin(local_68);
            local_48 = (atom_iterator ****)
                       PrgDisj::end((PrgDisj *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          }
          for (; local_40 != local_48; local_40 = (atom_iterator ****)((long)local_40 + 4)) {
            pPVar4 = LogicProgram::getAtom
                               ((LogicProgram *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                (Id_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
            local_28 = PrgAtom::scc(pPVar4);
            if ((local_28 != 0x7ffffff) && ((local_20 & 1L << ((byte)local_28 & 0x3f)) != 0)) {
              if ((local_29 & 1) == 0) {
                return local_28;
              }
              for (local_6c = 0; local_6c != local_24; local_6c = local_6c + 1) {
                in_stack_ffffffffffffff68 = local_18;
                in_stack_ffffffffffffff74 = local_28;
                local_70 = goal(local_18,0);
                Literal::var(&local_70);
                pPVar4 = LogicProgram::getAtom
                                   ((LogicProgram *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    (Id_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
                uVar3 = PrgAtom::scc(pPVar4);
                if (in_stack_ffffffffffffff74 == uVar3) {
                  return local_28;
                }
              }
            }
          }
        }
      }
      return 0x7ffffff;
    }
    ctx = (EVP_PKEY_CTX *)(ulong)local_30;
    local_34 = goal(in_stack_ffffffffffffff68,0);
    uVar2 = Literal::sign(&local_34,ctx,sig,in_RCX,in_R8,in_R9);
    if ((uVar2 & 1) != 0) {
      local_24 = local_30;
      goto LAB_001a5a75;
    }
    local_38 = goal(in_stack_ffffffffffffff68,0);
    Literal::var(&local_38);
    pPVar4 = LogicProgram::getAtom
                       ((LogicProgram *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (Id_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    local_28 = PrgAtom::scc(pPVar4);
    if (local_28 != 0x7ffffff) {
      local_20 = 1L << ((byte)local_28 & 0x3f) | local_20;
      in_RCX = (size_t *)(ulong)(0x3f < local_28);
      local_29 = (local_29 & 1) != 0 || 0x3f < local_28;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

uint32 PrgBody::scc(const LogicProgram& prg) const {
	uint64 sccMask = 0;
	uint32 end     = size();
	uint32 scc     = PrgNode::noScc;
	bool   large   = false;
	for (uint32 i  = 0; i != end; ++i) {
		if      (goal(i).sign()) {
			end = i;
			break;
		}
		else if ((scc = prg.getAtom(goal(i).var())->scc()) != PrgNode::noScc) {
			sccMask |= uint64(1) << (scc & 63);
			large   |= scc > 63;
		}
	}
	if (sccMask != 0) {
		PrgDisj::atom_iterator aIt = 0, aEnd = 0;
		Var head;
		for (head_iterator h = heads_begin(), hEnd = heads_end(); h != hEnd; ++h) {
			if (h->isAtom()) { head = h->node(); aIt = &head, aEnd = aIt + 1; }
			else             { PrgDisj* d = prg.getDisj(h->node()); aIt = d->begin(), aEnd = d->end(); }
			for (; aIt != aEnd; ++aIt) {
				scc = prg.getAtom(*aIt)->scc();
				if (scc != PrgNode::noScc && (sccMask & (uint64(1) << (scc&63))) != 0) {
					if (!large) { return scc; }
					for (uint32 j = 0; j != end; ++j) {
						if (scc == prg.getAtom(goal(j).var())->scc()) { return scc; }
					}
				}
			}
		}
	}
	return PrgNode::noScc;
}